

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O1

_Bool black_market_ok(town_conflict *town,object *obj)

{
  store *psVar1;
  bool bVar2;
  wchar_t wVar3;
  _Bool _Var4;
  object *poVar5;
  
  _Var4 = true;
  if ((((obj->ego == (ego_item *)0x0) && (obj->to_a < 3)) && (obj->to_h < 2)) && (obj->to_d < 3)) {
    wVar3 = object_value_real(obj,L'\x01');
    if (wVar3 < L'\n') {
LAB_001d1d91:
      _Var4 = false;
    }
    else {
      for (psVar1 = town->stores; psVar1 != (store *)0x0; psVar1 = psVar1->next) {
        bVar2 = false;
        if ((psVar1->sidx != store_black_market_idx) && (psVar1->sidx != store_home_idx)) {
          poVar5 = psVar1->stock;
          bVar2 = false;
          if (poVar5 != (object *)0x0) {
            do {
              if (obj->kind == poVar5->kind) {
                bVar2 = true;
                break;
              }
              poVar5 = poVar5->next;
            } while (poVar5 != (object *)0x0);
          }
        }
        if (bVar2) goto LAB_001d1d91;
      }
    }
  }
  return _Var4;
}

Assistant:

static bool black_market_ok(struct town *town, const struct object *obj)
{
	struct store *store;

	/* Ego items are always fine */
	if (obj->ego) return true;

	/* Good items are normally fine */
	if (obj->to_a > 2) return true;
	if (obj->to_h > 1) return true;
	if (obj->to_d > 2) return true;

	/* No cheap items */
	if (object_value_real(obj, 1) < 10) return (false);

	/* Check the other stores */
	for (store = town->stores; store; store = store->next) {
		struct object *stock_obj;

		/* Skip home and black market */
		if (store_is_black_market(store) || store_is_home(store))
			continue;

		/* Check every object in the store */
		for (stock_obj = store->stock; stock_obj; stock_obj = stock_obj->next) {
			/* Compare object kinds */
			if (obj->kind == stock_obj->kind)
				return false;
		}
	}

	/* Otherwise fine */
	return true;
}